

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O1

int get_byte(gz_stream *s)

{
  uInt *puVar1;
  byte *pbVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  uint uVar6;
  
  uVar6 = 0xffffffff;
  if (s->z_eof == 0) {
    if ((s->stream).avail_in == 0) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      sVar5 = fread(s->inbuf,1,0x4000,(FILE *)s->file);
      (s->stream).avail_in = (uInt)sVar5;
      if ((uInt)sVar5 == 0) {
        s->z_eof = 1;
        iVar3 = ferror((FILE *)s->file);
        if (iVar3 == 0) {
          return -1;
        }
        s->z_err = -1;
        return -1;
      }
      (s->stream).next_in = s->inbuf;
    }
    puVar1 = &(s->stream).avail_in;
    *puVar1 = *puVar1 - 1;
    pbVar2 = (s->stream).next_in;
    (s->stream).next_in = pbVar2 + 1;
    uVar6 = (uint)*pbVar2;
  }
  return uVar6;
}

Assistant:

local int get_byte(s)
    gz_stream *s;
{
    if (s->z_eof) return EOF;
    if (s->stream.avail_in == 0) {
        errno = 0;
        s->stream.avail_in = (uInt)fread(s->inbuf, 1, Z_BUFSIZE, s->file);
        if (s->stream.avail_in == 0) {
            s->z_eof = 1;
            if (ferror(s->file)) s->z_err = Z_ERRNO;
            return EOF;
        }
        s->stream.next_in = s->inbuf;
    }
    s->stream.avail_in--;
    return *(s->stream.next_in)++;
}